

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_chroma_mode_11_to_17
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  uint uVar2;
  UWORD8 *pUVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  UWORD8 *pUVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bStack_b8;
  UWORD8 aUStack_b7 [135];
  
  iVar1 = gai4_ihevc_ang_table[mode];
  uVar2 = nt * 2;
  uVar6 = nt * 2 + 2;
  if (0 < (int)uVar6) {
    pbVar10 = pu1_ref + (long)(nt * 4) + 1;
    uVar11 = 0;
    do {
      (&bStack_b8)[uVar11 + (long)(int)(uVar2 - 2)] = pbVar10[-1];
      (&bStack_b8)[(int)((uVar2 - 1) + (int)uVar11)] = *pbVar10;
      uVar11 = uVar11 + 2;
      pbVar10 = pbVar10 + -2;
    } while (uVar11 < uVar6);
  }
  lVar5 = (long)(int)(uVar2 - 2);
  uVar6 = iVar1 * nt >> 4;
  if ((int)uVar6 < -2) {
    iVar9 = idx_neg_idx_chroma_11_17[(long)mode + 0x11];
    iVar4 = iVar9 + 0x80;
    lVar12 = -2;
    do {
      uVar7 = iVar4 >> 7 & 0xfffffffe;
      (&bStack_b8)[lVar12 + lVar5] = pu1_ref[(int)(uVar7 + nt * 4)];
      aUStack_b7[lVar12 + lVar5] = pu1_ref[(int)(uVar7 + nt * 4 + 1)];
      lVar12 = lVar12 + -2;
      iVar4 = iVar4 + iVar9;
    } while ((int)(uVar6 & 0xfffffffe) < lVar12);
  }
  if (0 < (int)uVar2) {
    pUVar3 = pu1_dst + 1;
    uVar11 = 0;
    do {
      if (0 < nt) {
        uVar7 = ((int)(uVar11 >> 1) + 1) * iVar1;
        uVar6 = uVar7 & 0x1f;
        iVar9 = ((int)uVar7 >> 5) * 2 + 5;
        pUVar8 = pUVar3;
        uVar13 = (ulong)(uint)nt;
        do {
          pUVar8[-1] = (UWORD8)((&bStack_b8)[(iVar9 + -1) + lVar5] * uVar6 +
                                (uint)(&bStack_b8)[(iVar9 + -3) + lVar5] * (0x20 - uVar6) + 0x10 >>
                               5);
          *pUVar8 = (UWORD8)((uint)(&bStack_b8)[(iVar9 + -2) + lVar5] * (0x20 - uVar6) +
                             (&bStack_b8)[iVar9 + lVar5] * uVar6 + 0x10 >> 5);
          iVar9 = iVar9 + 2;
          pUVar8 = pUVar8 + dst_strd;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar11 = uVar11 + 2;
      pUVar3 = pUVar3 + 2;
    } while (uVar11 < uVar2);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_11_to_17(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    /* This function and ihevc_intra_pred_CHROMA_mode_19_to_25 are same except*/
    /* for ref main & side samples assignment,can be combined for */
    /* optimzation*/

    WORD32 row, col, k;
    WORD32 intra_pred_ang, inv_ang, inv_ang_sum;
    WORD32 idx_u, idx_v, ref_main_idx_u, ref_main_idx_v, ref_idx;
    WORD32 pos_u, pos_v, fract_u, fract_v;

    UWORD8 ref_temp[2 * MAX_CU_SIZE + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);
    inv_ang_sum = 128;

    intra_pred_ang = gai4_ihevc_ang_table[mode];

    inv_ang = gai4_ihevc_inv_ang_table[mode - 11];
    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/

    /* For horizontal modes, (ref main = ref left) (ref side = ref above) */


    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k + 1];
    }

    ref_main = ref_temp + (2 * (nt - 1));
    ref_idx = (nt * intra_pred_ang) >> 5;

    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) + ((inv_ang_sum >> 8) << 1)];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) + ((inv_ang_sum >> 8) << 1)];
    }

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */
    for(col = 0; col < (2 * nt); col += 2)
    {
        pos_u = ((col / 2 + 1) * intra_pred_ang);
        pos_v = ((col / 2 + 1) * intra_pred_ang);
        idx_u = pos_u >> 5;
        idx_v = pos_v >> 5;
        fract_u = pos_u & (31);
        fract_v = pos_v & (31);

        // Do linear filtering
        for(row = 0; row < nt; row++)
        {
            ref_main_idx_u = 2 * (row + idx_u + 1);
            ref_main_idx_v = 2 * (row + idx_v + 1) + 1;

            pu1_dst[col + (dst_strd * row)] = (UWORD8)(((32 - fract_u)
                            * ref_main[ref_main_idx_u]
                            + fract_u * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (dst_strd * row)] = (UWORD8)(((32 - fract_v)
                            * ref_main[ref_main_idx_v]
                            + fract_v * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}